

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fzn-chuffed.cpp
# Opt level: O0

string * get_bv_string_abi_cxx11_(BoolView *b,bool tryIntDom)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  ChannelInfo *pCVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  byte in_DL;
  BoolView *in_RSI;
  string *in_RDI;
  stringstream ss_1;
  string ivstring;
  ChannelInfo ci_1;
  Lit l_1;
  string ostring_1;
  BoolView o_1;
  string bvstring;
  string ostring;
  BoolView o;
  stringstream ss;
  ChannelInfo ci;
  Lit l;
  string s;
  BoolView *in_stack_fffffffffffffae8;
  BoolView *in_stack_fffffffffffffaf0;
  allocator *paVar8;
  key_type *in_stack_fffffffffffffb28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  allocator local_451;
  stringstream local_450 [16];
  ostream local_440 [376];
  string local_2c8 [36];
  int local_2a4;
  ChannelInfo local_2a0;
  int local_294;
  string local_290 [32];
  undefined1 local_270 [48];
  string local_240 [32];
  string local_220 [32];
  BoolView local_200;
  undefined4 local_1ec;
  stringstream local_1e8 [16];
  ostream local_1d8 [380];
  int local_5c;
  ChannelInfo local_58;
  int local_3c;
  string local_38 [39];
  byte local_11;
  BoolView *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_38);
  if ((local_11 & 1) == 0) {
    pmVar7 = std::
             map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    std::__cxx11::string::string((string *)(local_270 + 0x10),(string *)pmVar7);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::string((string *)in_RDI,(string *)(local_270 + 0x10));
      local_1ec = 1;
    }
    else {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270;
      BoolView::BoolView(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
      uVar2 = BoolView::getSign((BoolView *)__rhs);
      BoolView::setSign((BoolView *)local_270,(bool)(~uVar2 & 1));
      pmVar7 = std::
               map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)__rhs,in_stack_fffffffffffffb28);
      std::__cxx11::string::string(local_290,(string *)pmVar7);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::operator+((char *)CONCAT17(uVar2,in_stack_fffffffffffffb38),__rhs);
        local_1ec = 1;
      }
      else {
        local_2a4 = (int)BoolView::getLit(in_stack_fffffffffffffae8,false);
        local_294 = local_2a4;
        uVar3 = var((Lit)local_2a4);
        pCVar4 = vec<ChannelInfo>::operator[](&sat.c_info,uVar3);
        local_2a0 = *pCVar4;
        vec<IntVar_*>::operator[](&engine.vars,local_2a0._0_4_ & 0x1fffffff);
        pmVar5 = std::
                 map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)__rhs,(key_type *)pmVar7);
        std::__cxx11::string::string(local_2c8,(string *)pmVar5);
        if ((((uint)local_2a0._0_4_ >> 0x1d & 3) == 1) &&
           (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
          std::__cxx11::stringstream::stringstream(local_450);
          std::operator<<(local_440,local_2c8);
          uVar3 = (uint)local_2a0._0_4_ >> 0x1c;
          bVar1 = BoolView::getSign(local_10);
          std::operator<<(local_440,irel_str[(int)((uVar3 & 6) + (uint)bVar1)]);
          std::ostream::operator<<(local_440,local_2a0.val);
          std::__cxx11::stringstream::str();
          local_1ec = 1;
          std::__cxx11::stringstream::~stringstream(local_450);
        }
        else {
          paVar8 = &local_451;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)in_RDI,"<UNKNOWN>",paVar8);
          std::allocator<char>::~allocator((allocator<char> *)&local_451);
          local_1ec = 1;
        }
        std::__cxx11::string::~string(local_2c8);
      }
      std::__cxx11::string::~string(local_290);
      BoolView::~BoolView((BoolView *)0x11a2d7);
    }
    std::__cxx11::string::~string((string *)(local_270 + 0x10));
  }
  else {
    local_5c = (int)BoolView::getLit(in_stack_fffffffffffffae8,false);
    local_3c = local_5c;
    uVar3 = var((Lit)local_5c);
    pCVar4 = vec<ChannelInfo>::operator[](&sat.c_info,uVar3);
    local_58 = *pCVar4;
    vec<IntVar_*>::operator[](&engine.vars,local_58._0_4_ & 0x1fffffff);
    pmVar5 = std::
             map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffffb30,(key_type *)in_stack_fffffffffffffb28);
    std::__cxx11::string::operator=(local_38,(string *)pmVar5);
    if ((((uint)local_58._0_4_ >> 0x1d & 3) == 1) &&
       (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
      std::__cxx11::stringstream::stringstream(local_1e8);
      std::operator<<(local_1d8,local_38);
      uVar3 = (uint)local_58._0_4_ >> 0x1c;
      bVar1 = BoolView::getSign(local_10);
      std::operator<<(local_1d8,irel_str[(int)((uVar3 & 6) + (uint)bVar1)]);
      std::ostream::operator<<(local_1d8,local_58.val);
      std::__cxx11::stringstream::str();
      local_1ec = 1;
      std::__cxx11::stringstream::~stringstream(local_1e8);
    }
    else {
      pmVar7 = std::
               map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
      std::__cxx11::string::operator=(local_38,(string *)pmVar7);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        BoolView::BoolView(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        bVar1 = BoolView::getSign(&local_200);
        BoolView::setSign(&local_200,(bool)(~bVar1 & 1));
        pmVar7 = std::
                 map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
        std::__cxx11::string::string(local_220,(string *)pmVar7);
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::operator+((char *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                         in_stack_fffffffffffffb30);
          std::__cxx11::string::operator=(local_38,local_240);
          std::__cxx11::string::~string(local_240);
        }
        else {
          std::__cxx11::string::operator=(local_38,"<UNKNOWN>");
        }
        std::__cxx11::string::~string(local_220);
        BoolView::~BoolView((BoolView *)0x119ee6);
      }
      std::__cxx11::string::string((string *)in_RDI,local_38);
      local_1ec = 1;
    }
  }
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string get_bv_string(const BoolView& b, bool tryIntDom) {
	std::string s;

	if (tryIntDom) {
		// Alternate version: prioritise intvars.
		const Lit l(b.getLit(true));
		const ChannelInfo ci(sat.c_info[var(l)]);
		s = intVarString[engine.vars[ci.cons_id]];
		if (ci.cons_type == 1 && !s.empty()) {
			// Int literal
			std::stringstream ss;
			ss << s;
			ss << irel_str[2 * ci.cons_type + static_cast<int>(b.getSign())];
			ss << ci.val;
			return ss.str();
		}
		s = boolVarString[b];
		if (s.empty()) {
			BoolView o(b);
			o.setSign(!o.getSign());
			const std::string ostring = boolVarString[o];
			if (!ostring.empty()) {
				s = "~ " + ostring;
			} else {
				s = "<UNKNOWN>";
			}
		}
		return s;

	}  // See if b or ~b have names.
	std::string bvstring = boolVarString[b];
	if (bvstring.empty()) {
		BoolView o(b);
		o.setSign(!o.getSign());
		const std::string ostring = boolVarString[o];
		if (ostring.empty()) {
			// Maybe it's attached to a (named) intvar.
			const Lit l(b.getLit(true));
			const ChannelInfo ci(sat.c_info[var(l)]);
			const std::string ivstring = intVarString[engine.vars[ci.cons_id]];
			if (ci.cons_type == 1 && !ivstring.empty()) {
				// If it is, return the denotation of b.
				std::stringstream ss;
				ss << ivstring;
				ss << irel_str[2 * ci.cons_type + static_cast<int>(b.getSign())];
				ss << ci.val;
				return ss.str();
			}
			return "<UNKNOWN>";
		}
		return "~ " + ostring;
	}
	return bvstring;
}